

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ocsp.cc
# Opt level: O1

bool bssl::anon_unknown_20::VerifyOCSPResponseSignature
               (OCSPResponse *response,OCSPResponseData *response_data,
               ParsedCertificate *issuer_certificate)

{
  _Optional_payload_base<bssl::SignatureAlgorithm> _Var1;
  Span<const_unsigned_char> *pSVar2;
  ParsedCertificate *pPVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  char cVar7;
  pointer pIVar8;
  Input *key_purpose_oid;
  Span<const_unsigned_char> *pSVar9;
  ResponderID *id;
  string_view der;
  Input rhs;
  shared_ptr<const_bssl::ParsedCertificate> cur_responder_certificate;
  ParsedCertificate *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  BitString *local_50;
  ResponderID *local_48;
  ParsedCertificate *local_40;
  pointer local_38;
  
  id = &response_data->responder_id;
  bVar4 = CheckResponderIDMatchesCertificate(id,issuer_certificate);
  if ((bVar4) &&
     (bVar4 = VerifySignedData(response->signature_algorithm,(Input)(response->data).data_,
                               &response->signature,(Input)(issuer_certificate->tbs_).spki_tlv.data_
                               ,(SignatureVerifyCache *)0x0), bVar4)) {
    return true;
  }
  pIVar8 = (response->certs).super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (response->certs).
             super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
             super__Vector_impl_data._M_finish;
  bVar4 = pIVar8 != local_38;
  if (bVar4) {
    local_50 = &response->signature;
    do {
      der._M_str = (char *)(pIVar8->data_).size_;
      der._M_len = (size_t)&local_60;
      OCSPParseCertificate(der);
      cVar7 = '\x03';
      if ((((local_60 != (ParsedCertificate *)0x0) &&
           (bVar5 = CheckResponderIDMatchesCertificate(id,local_60), pPVar3 = local_60, bVar5)) &&
          (_Var1 = (local_60->signature_algorithm_).
                   super__Optional_base<bssl::SignatureAlgorithm,_true,_true>._M_payload.
                   super__Optional_payload_base<bssl::SignatureAlgorithm>,
          ((ulong)_Var1 >> 0x20 & 1) != 0)) &&
         ((bVar5 = VerifySignedData(_Var1._M_payload._M_value,
                                    (Input)(local_60->tbs_certificate_tlv_).data_,
                                    &local_60->signature_value_,
                                    (Input)(issuer_certificate->tbs_).spki_tlv.data_,
                                    (SignatureVerifyCache *)0x0), bVar5 &&
          (pPVar3->has_extended_key_usage_ == true)))) {
        pSVar9 = &((pPVar3->extended_key_usage_).
                   super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
                   super__Vector_impl_data._M_start)->data_;
        pSVar2 = &((pPVar3->extended_key_usage_).
                   super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
                   super__Vector_impl_data._M_finish)->data_;
        local_48 = id;
        local_40 = issuer_certificate;
        while ((bVar5 = pSVar9 != pSVar2, bVar5 &&
               (rhs.data_.size_ = 8,
               rhs.data_.data_ = "+\x06\x01\x05\x05\a\x03\tSerial number is not a valid INTEGER",
               bVar6 = bssl::der::operator==((Input)*pSVar9,rhs), !bVar6))) {
          pSVar9 = pSVar9 + 1;
        }
        issuer_certificate = local_40;
        id = local_48;
        if (bVar5) {
          cVar7 = VerifySignedData(response->signature_algorithm,(Input)(response->data).data_,
                                   local_50,(Input)(local_60->tbs_).spki_tlv.data_,
                                   (SignatureVerifyCache *)0x0);
        }
      }
      if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
      }
      if ((cVar7 != '\x03') && (cVar7 != '\0')) {
        return bVar4;
      }
      pIVar8 = pIVar8 + 1;
      bVar4 = pIVar8 != local_38;
    } while (bVar4);
  }
  return bVar4;
}

Assistant:

[[nodiscard]] bool VerifyOCSPResponseSignature(
    const OCSPResponse &response, const OCSPResponseData &response_data,
    const ParsedCertificate *issuer_certificate) {
  // In order to verify the OCSP signature, a valid responder matching the OCSP
  // Responder ID must be located (RFC 6960, 4.2.2.2). The responder is allowed
  // to be either the certificate issuer or a delegated authority directly
  // signed by the issuer.
  if (CheckResponderIDMatchesCertificate(response_data.responder_id,
                                         issuer_certificate) &&
      VerifyOCSPResponseSignatureGivenCert(response, issuer_certificate)) {
    return true;
  }

  // Otherwise search through the provided certificates for the Authorized
  // Responder. Want a certificate that:
  //  (1) Matches the OCSP Responder ID.
  //  (2) Has been given authority for OCSP signing by |issuer_certificate|.
  //  (3) Has signed the OCSP response using its public key.
  for (const auto &responder_cert_tlv : response.certs) {
    std::shared_ptr<const ParsedCertificate> cur_responder_certificate =
        OCSPParseCertificate(BytesAsStringView(responder_cert_tlv));

    // If failed parsing the certificate, keep looking.
    if (!cur_responder_certificate) {
      continue;
    }

    // If the certificate doesn't match the OCSP's responder ID, keep looking.
    if (!CheckResponderIDMatchesCertificate(response_data.responder_id,
                                            cur_responder_certificate.get())) {
      continue;
    }

    // If the certificate isn't a valid Authorized Responder certificate, keep
    // looking.
    if (!VerifyAuthorizedResponderCert(cur_responder_certificate.get(),
                                       issuer_certificate)) {
      continue;
    }

    // If the certificate signed this OCSP response, have found a match.
    // Otherwise keep looking.
    if (VerifyOCSPResponseSignatureGivenCert(response,
                                             cur_responder_certificate.get())) {
      return true;
    }
  }

  // Failed to confirm the validity of the OCSP signature using any of the
  // candidate certificates.
  return false;
}